

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::encodeDifference(void *data,int size,DataType dt)

{
  char cVar1;
  short sVar2;
  long lVar3;
  char cVar4;
  short sVar5;
  
  if (dt == dt_uint16) {
    if (2 < size + 1U) {
      lVar3 = 0;
      sVar5 = 0;
      do {
        sVar2 = *(short *)((long)data + lVar3);
        *(short *)((long)data + lVar3) = sVar2 - sVar5;
        lVar3 = lVar3 + 2;
        sVar5 = sVar2;
      } while ((long)(size / 2) * 2 != lVar3);
    }
  }
  else if ((dt == dt_uint8) && (size != 0)) {
    lVar3 = 0;
    cVar4 = '\0';
    do {
      cVar1 = *(char *)((long)data + lVar3);
      *(char *)((long)data + lVar3) = cVar1 - cVar4;
      lVar3 = lVar3 + 1;
      cVar4 = cVar1;
    } while (size != lVar3);
  }
  return;
}

Assistant:

void encodeDifference(void* data, int size, DataType dt)
{
    switch (dt) {
    case dt_uint8:    encodeDifference(static_cast<uint8_t*>(data), size); break;
    case dt_uint16:   encodeDifference(static_cast<uint16_t*>(data), size); break;
    default: break; // skip other types
    }
}